

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCnf.c
# Opt level: O2

void Ssw_ObjAddToFrontier(Ssw_Sat_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int Entry;
  int i;
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                  ,0x144,"void Ssw_ObjAddToFrontier(Ssw_Sat_t *, Aig_Obj_t *, Vec_Ptr_t *)");
  }
  iVar1 = Ssw_ObjSatNum(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Ssw_ObjSatNum(p,pObj);
    if (iVar1 != 0) {
      __assert_fail("Ssw_ObjSatNum(p,pObj) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswCnf.c"
                    ,0x147,"void Ssw_ObjAddToFrontier(Ssw_Sat_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    uVar2 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
    if (uVar2 != 1) {
      iVar1 = extraout_EDX;
      if (uVar2 == 2) {
        Vec_PtrPush(p->vUsedPis,pObj);
        iVar1 = extraout_EDX_00;
      }
      Entry = p->nSatVars;
      p->nSatVars = Entry + 1;
      p_00 = p->vSatVars;
      i = pObj->Id;
      Vec_IntFillExtra(p_00,i + 1,iVar1);
      Vec_IntWriteEntry(p_00,i,Entry);
      sat_solver_setnvars(p->pSat,(p->nSatVars - p->nSatVars % 100) + 100);
      if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
        Vec_PtrPush(vFrontier,pObj);
        return;
      }
    }
  }
  return;
}

Assistant:

void Ssw_ObjAddToFrontier( Ssw_Sat_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Aig_IsComplement(pObj) );
    if ( Ssw_ObjSatNum(p,pObj) )
        return;
    assert( Ssw_ObjSatNum(p,pObj) == 0 );
    if ( Aig_ObjIsConst1(pObj) )
        return;
//    pObj->fMarkA = 1;
    // save PIs (used by register correspondence)
    if ( Aig_ObjIsCi(pObj) )
        Vec_PtrPush( p->vUsedPis, pObj );
    Ssw_ObjSetSatNum( p, pObj, p->nSatVars++ );
    sat_solver_setnvars( p->pSat, 100 * (1 + p->nSatVars / 100) );
    if ( Aig_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}